

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# testparse.c
# Opt level: O1

void print_symbols(MOJOSHADER_symbol *sym,uint symbol_count,uint indent)

{
  uint uVar1;
  ulong uVar2;
  
  uVar1 = indent;
  if (indent != 0) {
    do {
      printf("    ");
      uVar1 = uVar1 - 1;
    } while (uVar1 != 0);
  }
  printf("SYMBOLS:");
  if (symbol_count == 0) {
    puts(" (none.)");
    return;
  }
  putchar(10);
  uVar2 = 0;
  do {
    uVar1 = indent;
    if (indent == 0) {
      printf("    * %d: \"%s\"\n",uVar2,sym->name);
    }
    else {
      do {
        printf("    ");
        uVar1 = uVar1 - 1;
      } while (uVar1 != 0);
      printf("    * %d: \"%s\"\n",uVar2,sym->name);
      uVar1 = indent;
      do {
        printf("    ");
        uVar1 = uVar1 - 1;
      } while (uVar1 != 0);
    }
    printf("      register set %s\n",
           print_symbols_regsets_rel +
           *(int *)(print_symbols_regsets_rel + (ulong)sym->register_set * 4));
    uVar1 = indent;
    if (indent == 0) {
      printf("      register index %u\n",(ulong)sym->register_index);
    }
    else {
      do {
        printf("    ");
        uVar1 = uVar1 - 1;
      } while (uVar1 != 0);
      printf("      register index %u\n",(ulong)sym->register_index);
      uVar1 = indent;
      do {
        printf("    ");
        uVar1 = uVar1 - 1;
      } while (uVar1 != 0);
    }
    printf("      register count %u\n",(ulong)sym->register_count);
    print_typeinfo(&sym->info,indent);
    uVar1 = (int)uVar2 + 1;
    uVar2 = (ulong)uVar1;
    sym = sym + 1;
  } while (uVar1 != symbol_count);
  putchar(10);
  return;
}

Assistant:

static void print_symbols(const MOJOSHADER_symbol *sym,
                          const unsigned int symbol_count,
                          const unsigned int indent)
{
    INDENT(); printf("SYMBOLS:");
    if (symbol_count == 0)
        printf(" (none.)\n");
    else
    {
        int i;
        printf("\n");
        for (i = 0; i < symbol_count; i++, sym++)
        {
            static const char *regsets[] = {
                "bool", "int4", "float4", "sampler"
            };

            INDENT(); printf("    * %d: \"%s\"\n", i, sym->name);
            INDENT(); printf("      register set %s\n", regsets[sym->register_set]);
            INDENT(); printf("      register index %u\n", sym->register_index);
            INDENT(); printf("      register count %u\n", sym->register_count);
            print_typeinfo(&sym->info, indent);
        } // for
        printf("\n");
    } // else
}